

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

double * __thiscall
google::protobuf::RepeatedField<double>::elements(RepeatedField<double> *this,bool is_soo)

{
  int iVar1;
  double *pdVar2;
  undefined7 in_register_00000031;
  
  iVar1 = 1;
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (0 < iVar1) {
    if (is_soo) {
      return (double *)((long)&(this->soo_rep_).field_0 + 8);
    }
    pdVar2 = (double *)internal::LongSooRep::elements((LongSooRep *)this);
    return pdVar2;
  }
  elements();
}

Assistant:

Element* elements(bool is_soo) {
    ABSL_DCHECK_GT(Capacity(is_soo), 0);
    return unsafe_elements(is_soo);
  }